

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O3

void chebyshev3_compute(int n,double *x,double *w)

{
  ostream *poVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar5;
  double dVar6;
  ulong uVar4;
  
  if (n < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"CHEBYSHEV3_COMPUTE - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  N must be at least 1.\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  The input value was N = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
    std::operator<<(poVar1,"\n");
    exit(1);
  }
  if (n == 1) {
    *x = 0.0;
    *w = 3.141592653589793;
  }
  else {
    uVar3 = n - 1;
    uVar4 = (ulong)uVar3;
    uVar5 = 0;
    uVar2 = uVar4;
    do {
      dVar6 = cos(((double)(int)uVar2 * 3.141592653589793) / (double)(int)uVar3);
      x[uVar5] = dVar6;
      uVar5 = uVar5 + 1;
      uVar2 = (ulong)((int)uVar2 - 1);
    } while ((uint)n != uVar5);
    dVar6 = 3.141592653589793 / (double)(int)(uVar3 * 2);
    *w = dVar6;
    if (2 < n) {
      uVar2 = 1;
      do {
        w[uVar2] = 3.141592653589793 / (double)(int)uVar3;
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
    w[uVar4] = dVar6;
  }
  return;
}

Assistant:

void chebyshev3_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBYSHEV3_COMPUTE computes a Gauss-Chebyshev type 3 quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) f(x) / sqrt ( 1 - x * x ) dx
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= N ) W(I) * F ( X(I) )
//
//    The N = 1 rule is exceptional.  It consists of a single
//    point at 0, with weight PI.
//
//    For rules with N = 2 or greater, the following remarks apply:
//
//    If N points are used, then Gauss-Chebyshev quadrature
//    will compute the integral exactly, whenever F(X) is a polynomial
//    of degree 2*N-3 or less.
//
//    The abscissas include -1 and 1.
//
//    The first and last weights are 0.5 * PI / ( N - 1),
//    and all other weights are PI / ( N - 1 ).
//
//    If the order is doubled, the abscissas of the new rule include
//    all the points of the old rule.  This fact can be used to
//    efficiently implement error estimation.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    30 April 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Daniel Zwillinger, editor,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996,
//    ISBN: 0-8493-2479-3.
//
//  Parameters:
//
//    Input, int N, the order.
//    1 <= N.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double angle;
  int i;
  const double r8_pi = 3.141592653589793;

  if ( n < 1 )
  {
    std::cerr << "\n";
    std::cerr << "CHEBYSHEV3_COMPUTE - Fatal error!\n";
    std::cerr << "  N must be at least 1.\n";
    std::cerr << "  The input value was N = " << n << "\n";
    exit ( 1 );
  }
//
//  Take care of the special case N = 1.
//
  if ( n == 1 )
  {
    x[0] = 0.0;
    w[0] = r8_pi;
    return;
  }

  for ( i = 0; i < n; i++ )
  {
    angle = double( n - 1 - i ) * r8_pi / double( n - 1 );
    x[i] = cos ( angle );
  }

  w[0] = r8_pi / double( 2 * ( n - 1 ) );
  for ( i = 1; i < n - 1; i++ )
  {
    w[i] = r8_pi / double( n - 1 );
  }
  w[n-1] = r8_pi / double( 2 * ( n - 1 ) );

  return;
}